

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# set_timings.c
# Opt level: O2

int launch(nvamemtiming_conf *conf,FILE *outf,uint8_t progression,color color)

{
  ushort uVar1;
  bool bVar2;
  uint8_t *puVar3;
  FILE *pFVar4;
  __time_t _Var5;
  __time_t _Var6;
  int iVar7;
  uint uVar8;
  __pid_t _Var9;
  char *pcVar10;
  Display *dpy;
  size_t sVar11;
  undefined7 in_register_00000011;
  undefined1 *ref_val;
  uint32_t regs_len;
  uint32_t reg;
  FILE *__stream;
  ulong uVar12;
  color color_00;
  nvamemtiming_conf *pnVar13;
  bool bVar14;
  int cur_perflvl;
  FILE *local_b8;
  nvamemtiming_conf *local_b0;
  color local_a4;
  uint local_a0;
  int local_9c;
  timeval tv;
  
  printf("--- Start sequence number %u\n",CONCAT71(in_register_00000011,progression) & 0xffffffff);
  iVar7 = system("rmmod nvidia");
  if (iVar7 == 0x7f) {
    fwrite("rmmod not found. Abort\n",0x17,1,_stderr);
    iVar7 = 2;
  }
  else {
    iVar7 = vbios_upload_pramin(conf->cnum,(conf->vbios).data,(uint)(conf->vbios).length);
    if (iVar7 != 1) {
      fwrite("upload failed. Abort\n",0x15,1,_stderr);
      iVar7 = 3;
      goto LAB_00103393;
    }
    setenv("DISPLAY",":0",1);
    if (conf->mmiotrace != false) {
      uVar8 = mount("debugfs","/sys/kernel/debug","debugfs",0,(void *)0x0);
      pFVar4 = _stderr;
      if (uVar8 != 0) {
        pcVar10 = strerror(uVar8);
        fprintf(pFVar4,"mounting debugfs returned error %i: %s\n",(ulong)uVar8,pcVar10);
      }
      iVar7 = write_to_file("/sys/kernel/debug/tracing/buffer_size_kb","128000");
      pFVar4 = _stderr;
      if (iVar7 != 0) {
        pcVar10 = strerror(uVar8);
        fprintf(pFVar4,"Increasing the buffer size returned error %i: %s\n",(ulong)uVar8,pcVar10);
      }
      iVar7 = write_to_file("/sys/kernel/debug/tracing/current_tracer","mmiotrace");
      pFVar4 = _stderr;
      if (iVar7 != 0) {
        pcVar10 = strerror(uVar8);
        fprintf(pFVar4,"Changing the tracer returned error %i: %s\n",(ulong)uVar8,pcVar10);
      }
      iVar7 = write_to_file("/sys/kernel/debug/tracing/current_tracer","mmiotrace");
      pFVar4 = _stderr;
      if (iVar7 != 0) {
        pcVar10 = strerror(uVar8);
        fprintf(pFVar4,"Changing the tracer returned error %i: %s\n",(ulong)uVar8,pcVar10);
      }
      _Var9 = fork();
      if (_Var9 == 0) {
        pcVar10 = (char *)&tv;
        snprintf(pcVar10,100,"cat /sys/kernel/debug/tracing/trace_pipe > mmt_entry_%i",
                 CONCAT71(in_register_00000011,progression) & 0xffffffff);
        goto LAB_001033fd;
      }
      if (_Var9 < 0) {
        perror("fork");
      }
      puts("mmiotrace started");
    }
    _Var9 = fork();
    if (_Var9 != -1) {
      local_a4 = color;
      if (_Var9 == 0) {
        system("killall X 2> /dev/null > /dev/null");
        system("X > /dev/null 2> /dev/null");
        fwrite("X exited, let\'s quit!\n",0x16,1,_stderr);
        exit(0);
      }
      local_a0 = (uint)(conf->timing).perflvl;
      bVar2 = conf->mmiotrace;
      uVar8 = 0;
      do {
        usleep(10000);
        dpy = (Display *)XOpenDisplay(0);
        if (dpy != (Display *)0x0) break;
        bVar14 = uVar8 < 199;
        uVar8 = uVar8 + 1;
      } while (bVar14);
      fwrite("-- Display opened\n",0x12,1,_stderr);
      if (dpy == (Display *)0x0) {
        sVar11 = fwrite("ERROR - XOpenDisplay failed\n",0x1c,1,_stderr);
        return (int)sVar11;
      }
      cur_perflvl = -1;
      local_b8 = (FILE *)outf;
      local_b0 = conf;
      gettimeofday((timeval *)&tv,(__timezone_ptr_t)0x0);
      _Var5 = tv.tv_sec;
      XNVCTRLQueryTargetAttribute(dpy,0,0,0,0x109,&cur_perflvl);
      _Var9 = fork();
      if (_Var9 != -1) {
        if (_Var9 != 0) {
          sleep(1);
          do {
            usleep(10000);
            gettimeofday((timeval *)&tv,(__timezone_ptr_t)0x0);
            _Var6 = tv.tv_sec;
            XNVCTRLQueryTargetAttribute(dpy,0,0,0,0x107,&local_9c);
            if (local_9c == 1) break;
          } while (_Var5 + 2U < (ulong)_Var6);
          kill(_Var9,0xf);
          waitpid(_Var9,(int *)0x0,0);
          bVar14 = true;
          if ((bVar2 != false) &&
             (iVar7 = write_to_file("/sys/kernel/debug/tracing/trace_marker","Start downclocking\n")
             , pFVar4 = _stderr, iVar7 != 0)) {
            pcVar10 = strerror(1);
            bVar14 = false;
            fprintf(pFVar4,"Addind a marker to the mmiotrace returned error %i: %s\n",1,pcVar10);
          }
          gettimeofday((timeval *)&tv,(__timezone_ptr_t)0x0);
          _Var5 = tv.tv_sec;
          fwrite("XNVCTRLQueryTargetAttribute\n",0x1c,1,_stderr);
          XNVCTRLQueryTargetAttribute(dpy,1,0,0,0x10a,&cur_perflvl);
          if (cur_perflvl == 1) {
            uVar8 = 0xffffffff;
            do {
              gettimeofday((timeval *)&tv,(__timezone_ptr_t)0x0);
              if (_Var5 + 0x3cU < (ulong)tv.tv_sec) {
                fwrite("ERROR - Timeout\n",0x10,1,_stderr);
                goto LAB_00103035;
              }
              XNVCTRLQueryTargetAttribute(dpy,0,0,0,0x109,&cur_perflvl);
              iVar7 = cur_perflvl;
              pcVar10 = "NV_CTRL_GPU_CURRENT_PERFORMANCE_LEVEL = %d\n";
              if (((int)uVar8 < 0) ||
                 (pcVar10 = "Changed NV_CTRL_GPU_CURRENT_PERFORMANCE_LEVEL = %d\n",
                 cur_perflvl != uVar8)) {
                fprintf(_stderr,pcVar10,(ulong)(uint)cur_perflvl);
                uVar8 = iVar7;
              }
            } while (uVar8 != local_a0);
            fwrite("Downclock monitoring finished\n",0x1e,1,_stderr);
            sleep(1);
            XCloseDisplay(dpy);
            pFVar4 = _stderr;
            uVar8 = getpid();
            fprintf(pFVar4,"-- Display closed (pid = %i)\n",(ulong)uVar8);
            __stream = local_b8;
            pnVar13 = local_b0;
          }
          else {
            fwrite("ERROR - Driver not in Adaptive state\n",0x25,1,_stderr);
LAB_00103035:
            pnVar13 = local_b0;
            __stream = local_b8;
            sleep(1);
            XCloseDisplay(dpy);
            pFVar4 = _stderr;
            uVar8 = getpid();
            iVar7 = fprintf(pFVar4,"-- Display closed (pid = %i)\n",(ulong)uVar8);
            if (!bVar14) {
              return iVar7;
            }
          }
          if (pnVar13->mmiotrace != false) {
            iVar7 = write_to_file("/sys/kernel/debug/tracing/current_tracer","nop");
            if (iVar7 != 0) {
              fwrite("Copying the trace to a file failed\n",0x23,1,_stderr);
            }
            puts("mmiotrace stopped");
          }
          uVar1 = (pnVar13->vbios).timing_entry_offset;
          puVar3 = (pnVar13->vbios).data;
          fprintf(__stream,"timing entry [%u/%u]: ",(ulong)(uint)(int)(char)progression,
                  (ulong)(pnVar13->vbios).timing_entry_length);
          for (uVar12 = 0; pFVar4 = local_b8, uVar12 < (local_b0->vbios).timing_entry_length;
              uVar12 = uVar12 + 1) {
            pcVar10 = "%02x ";
            if ((int)(char)progression - 1 == uVar12) {
              pcVar10 = "\x1b[0;31m%02x\x1b[0m ";
            }
            fprintf(local_b8,pcVar10,(ulong)puVar3[uVar12 + uVar1]);
          }
          fputc(10,local_b8);
          pnVar13 = local_b0;
          iVar7 = local_b0->cnum;
          bVar14 = '\0' < (char)progression && local_a4 != NO_COLOR;
          if (nva_cards[iVar7].card_type < 0xc0) {
            color_00 = (color)bVar14;
            dump_regs(iVar7,(FILE *)pFVar4,(uint32_t *)dump_timings_ref_val1,
                      (uint)dump_timings_ref_exist,0x100220,0x30,color_00);
            dump_regs(pnVar13->cnum,(FILE *)pFVar4,(uint32_t *)dump_timings_ref_val2,
                      (uint)dump_timings_ref_exist,0x1002c0,0x30,color_00);
            regs_len = 0x10;
            dump_regs(pnVar13->cnum,(FILE *)pFVar4,(uint32_t *)dump_timings_ref_val3,
                      (uint)dump_timings_ref_exist,0x100510,0x10,color_00);
            iVar7 = pnVar13->cnum;
            ref_val = dump_timings_ref_val4;
            reg = 0x100710;
          }
          else {
            regs_len = 0x20;
            dump_regs(iVar7,(FILE *)pFVar4,(uint32_t *)dump_timings_ref_val3,
                      (uint)dump_timings_ref_exist,0x10f240,0x20,(uint)bVar14);
            dump_regs(pnVar13->cnum,(FILE *)pFVar4,(uint32_t *)dump_timings_ref_val1,
                      (uint)dump_timings_ref_exist,0x10f290,0xa0,(uint)bVar14);
            dump_regs(pnVar13->cnum,(FILE *)pFVar4,(uint32_t *)dump_timings_ref_val4,
                      (uint)dump_timings_ref_exist,0x10f610,0x10,(uint)bVar14);
            iVar7 = pnVar13->cnum;
            ref_val = dump_timings_ref_val2;
            reg = 0x10f720;
          }
          dump_regs(iVar7,(FILE *)pFVar4,(uint32_t *)ref_val,(uint)dump_timings_ref_exist,reg,
                    regs_len,(uint)bVar14);
          fputc(10,pFVar4);
          fflush(pFVar4);
          dump_timings_ref_exist = 1;
          system("killall X");
          do {
            _Var9 = wait((void *)0x0);
          } while (0 < _Var9);
          pnVar13->counter = pnVar13->counter + 1;
          uVar8 = sleep(5);
          return uVar8;
        }
        pcVar10 = "timeout 3 glxgears";
LAB_001033fd:
        iVar7 = system(pcVar10);
        exit(iVar7);
      }
    }
    fwrite("Fork failed! Abort\n",0x13,1,_stderr);
    iVar7 = 4;
  }
LAB_00103393:
  exit(iVar7);
}

Assistant:

static int
launch(struct nvamemtiming_conf *conf, FILE *outf, uint8_t progression, enum color color)
{
	printf("--- Start sequence number %u\n", progression);

	if (system("rmmod nvidia") == 127)
	{
		fprintf(stderr, "rmmod not found. Abort\n");
		exit (2);
	}

	if (vbios_upload_pramin(conf->cnum, conf->vbios.data, conf->vbios.length) != 1)
	{
		fprintf(stderr, "upload failed. Abort\n");
		exit(3);
	}

	/* modify our env so as we can launch apps on X */
	setenv("DISPLAY", ":0", 1);

	/* monitor downclocking */
	if (conf->mmiotrace)
		mmiotrace_start(progression);

	pid_t pid = fork();
	if (pid == 0) {
		system("killall X 2> /dev/null > /dev/null");
		system("X > /dev/null 2> /dev/null");
		fprintf(stderr, "X exited, let's quit!\n");
		exit(0);
	} else if (pid == -1) {
		fprintf(stderr, "Fork failed! Abort\n");
		exit (4);
	}

	/* X runs, wait for the right perflvl to be selected */
	if (force_timing_changes(conf->timing.perflvl, conf->mmiotrace))
		return 1;

	if (conf->mmiotrace)
                mmiotrace_stop();

	dump_timings(conf, outf, progression, color);

	system("killall X");

	/* wait for all zombie processes */
	while(wait(NULL) > 0);

	/* increase the launch counter */
	conf->counter++;

	/* wait for the nvidia driver to modeset back to the crappy resolution */
	sleep(5);

	return 0;
}